

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O1

void gimage::reduceGauss<unsigned_short,unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *target,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  ushort uVar1;
  int iVar2;
  float **ppfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  unsigned_short ***pppuVar7;
  unsigned_short ***pppuVar8;
  unsigned_short *puVar9;
  int iVar10;
  long i;
  long lVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  unsigned_short *puVar16;
  ushort *puVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  ImageFloat tmp;
  long local_f8;
  long local_f0;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (&local_68,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,image->height,1);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (target,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,
             (image->height - (image->height + 1 >> 0x3f)) + 1 >> 1,(long)image->depth);
  iVar2 = image->depth;
  if (0 < (long)iVar2) {
    ppfVar3 = *local_68.img;
    pfVar4 = *ppfVar3;
    lVar5 = image->width;
    lVar6 = image->height;
    pppuVar7 = target->img;
    local_f8 = 0;
    do {
      if (0 < lVar6) {
        iVar10 = iVar2 + -1;
        if ((int)local_f8 < iVar2 + -1) {
          iVar10 = (int)local_f8;
        }
        lVar12 = 0;
        pfVar13 = pfVar4;
        do {
          if (0 < lVar5) {
            lVar18 = lVar6 + -1;
            if (lVar12 < lVar6 + -1) {
              lVar18 = lVar12;
            }
            pppuVar8 = image->img;
            lVar11 = 0;
            do {
              if (lVar11 == 0 || lVar5 + -2 <= lVar11) {
                fVar22 = 0.0;
                lVar20 = 0;
                lVar19 = lVar11;
                do {
                  lVar21 = 2;
                  if (2 < lVar19) {
                    lVar21 = lVar19;
                  }
                  lVar14 = lVar21 + -2;
                  if (lVar5 + -1 <= lVar21 + -2) {
                    lVar14 = lVar5 + -1;
                  }
                  fVar22 = fVar22 + (float)pppuVar8[iVar10][lVar18][lVar14] *
                                    *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar20);
                  lVar20 = lVar20 + 4;
                  lVar19 = lVar19 + 1;
                } while (lVar20 != 0x14);
              }
              else {
                puVar17 = pppuVar8[local_f8][lVar12] + lVar11 + -2;
                fVar22 = 0.0;
                lVar19 = 0;
                do {
                  uVar1 = *puVar17;
                  puVar17 = puVar17 + 1;
                  fVar22 = fVar22 + (float)uVar1 *
                                    *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar19);
                  lVar19 = lVar19 + 4;
                } while (lVar19 != 0x14);
              }
              *pfVar13 = fVar22;
              pfVar13 = pfVar13 + 1;
              lVar11 = lVar11 + 2;
            } while (lVar11 < lVar5);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar6);
      }
      if (0 < local_68.width) {
        puVar9 = *pppuVar7[local_f8];
        lVar12 = target->width;
        lVar18 = 0;
        local_f0 = 0;
        do {
          if (0 < local_68.height) {
            puVar16 = puVar9 + local_f0;
            lVar11 = local_68.width + -1;
            if (local_f0 < local_68.width + -1) {
              lVar11 = local_f0;
            }
            iVar10 = local_68.depth;
            if (0 < local_68.depth) {
              iVar10 = 1;
            }
            lVar19 = 0;
            do {
              if (lVar19 == 0 || local_68.height + -2 <= lVar19) {
                fVar22 = 0.0;
                lVar21 = 0;
                lVar20 = lVar19;
                do {
                  lVar14 = 2;
                  if (2 < lVar20) {
                    lVar14 = lVar20;
                  }
                  lVar15 = lVar14 + -2;
                  if (local_68.height + -1 <= lVar14 + -2) {
                    lVar15 = local_68.height + -1;
                  }
                  fVar22 = fVar22 + *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar21) *
                                    local_68.img[(long)iVar10 + -1][lVar15][lVar11];
                  lVar21 = lVar21 + 4;
                  lVar20 = lVar20 + 1;
                } while (lVar21 != 0x14);
              }
              else {
                pfVar13 = (float *)((long)ppfVar3[lVar19 + -2] + lVar18);
                fVar22 = 0.0;
                lVar20 = 0;
                do {
                  fVar22 = fVar22 + *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar20) * *pfVar13;
                  lVar20 = lVar20 + 4;
                  pfVar13 = pfVar13 + local_68.width;
                } while (lVar20 != 0x14);
              }
              *puVar16 = (unsigned_short)(int)fVar22;
              puVar16 = puVar16 + lVar12;
              lVar19 = lVar19 + 2;
            } while (lVar19 < local_68.height);
          }
          local_f0 = local_f0 + 1;
          lVar18 = lVar18 + 4;
        } while (local_f0 != local_68.width);
      }
      local_f8 = local_f8 + 1;
    } while (local_f8 != iVar2);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  return;
}

Assistant:

void reduceGauss(Image<T> &target, const Image<S> &image)
{
  static const float g[]={0.0625, 0.25, 0.375, 0.25, 0.0625};

  // intermediate image with downscaled width

  ImageFloat tmp((image.getWidth()+1)/2, image.getHeight(), 1);

  // downscaled target image

  target.setSize((image.getWidth()+1)/2, (image.getHeight()+1)/2, image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into horizontally downscaled intermediate image

    float *tmpp=tmp.getPtr(0, 0, 0);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        float pv=0;

        if (i >= 2 && i < image.getWidth()-2)
        {
          S *p=image.getPtr(i-2, k, d);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p++;
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*image.getBounds(i+j-2, k, d);
          }
        }

        *tmpp++=pv;
      }
    }

    // convolve vertically into downscaled target image

    for (long i=0; i<tmp.getWidth(); i++)
    {
      T *tp=target.getPtr(i, 0, d);
      for (long k=0; k<tmp.getHeight(); k+=2)
      {
        float pv=0;

        if (k >= 2 && k < tmp.getHeight()-2)
        {
          float *p=tmp.getPtr(i, k-2, 0);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p;
            p+=tmp.getWidth();
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*tmp.getBounds(i, k+j-2, 0);
          }
        }

        *tp=static_cast<T>(pv);
        tp+=target.getWidth();
      }
    }
  }
}